

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loadable_extension_demo.cpp
# Opt level: O0

void SubPointFunction(DataChunk *args,ExpressionState *state,Vector *result)

{
  bool bVar1;
  idx_t iVar2;
  vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
  *this;
  idx_t iVar3;
  size_type sVar4;
  int *piVar5;
  TemplatedValidityMask<unsigned_long> *pTVar6;
  Vector *in_RDX;
  DataChunk *in_RDI;
  int *right_pdata;
  int *left_pdata;
  int *pdata;
  value_type *right_child_entry;
  value_type *left_child_entry;
  value_type *child_entry;
  size_t col;
  idx_t rhs_list_index;
  idx_t lhs_list_index;
  int base_idx;
  vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
  *right_child_entries;
  vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
  *left_child_entries;
  vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
  *child_entries;
  UnifiedVectorFormat rhs_data;
  UnifiedVectorFormat lhs_data;
  VectorType right_vector_type;
  VectorType left_vector_type;
  int count;
  value_type *right_vector;
  value_type *left_vector;
  int *in_stack_fffffffffffffe58;
  type in_stack_fffffffffffffe60;
  TemplatedValidityMask<unsigned_long> *in_stack_fffffffffffffe68;
  ulong local_108;
  int local_ec;
  SelectionVector *local_c0 [9];
  SelectionVector *local_78 [9];
  VectorType local_2e;
  VectorType local_2d;
  int local_2c;
  reference local_28;
  reference local_20;
  Vector *local_18;
  DataChunk *local_8;
  
  local_18 = in_RDX;
  local_8 = in_RDI;
  local_20 = duckdb::vector<duckdb::Vector,_true>::operator[]
                       ((vector<duckdb::Vector,_true> *)in_stack_fffffffffffffe60,
                        (size_type)in_stack_fffffffffffffe58);
  local_28 = duckdb::vector<duckdb::Vector,_true>::operator[]
                       ((vector<duckdb::Vector,_true> *)in_stack_fffffffffffffe60,
                        (size_type)in_stack_fffffffffffffe58);
  iVar2 = duckdb::DataChunk::size(local_8);
  local_2c = (int)iVar2;
  local_2d = duckdb::Vector::GetVectorType(local_20);
  local_2e = duckdb::Vector::GetVectorType(local_28);
  duckdb::DataChunk::Flatten();
  duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_78);
  duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_c0);
  duckdb::Vector::ToUnifiedFormat((ulong)local_20,(UnifiedVectorFormat *)(long)local_2c);
  duckdb::Vector::ToUnifiedFormat((ulong)local_28,(UnifiedVectorFormat *)(long)local_2c);
  duckdb::Vector::SetVectorType((VectorType)local_18);
  this = (vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
          *)duckdb::StructVector::GetEntries(local_18);
  duckdb::StructVector::GetEntries(local_20);
  duckdb::StructVector::GetEntries(local_28);
  for (local_ec = 0; local_ec < local_2c; local_ec = local_ec + 1) {
    iVar2 = duckdb::SelectionVector::get_index(local_78[0],(long)local_ec);
    iVar3 = duckdb::SelectionVector::get_index(local_c0[0],(long)local_ec);
    bVar1 = duckdb::TemplatedValidityMask<unsigned_long>::RowIsValid
                      (in_stack_fffffffffffffe68,(idx_t)in_stack_fffffffffffffe60);
    if ((bVar1) &&
       (bVar1 = duckdb::TemplatedValidityMask<unsigned_long>::RowIsValid
                          (in_stack_fffffffffffffe68,(idx_t)in_stack_fffffffffffffe60), bVar1)) {
      for (local_108 = 0;
          sVar4 = std::
                  vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                  ::size(this), local_108 < sVar4; local_108 = local_108 + 1) {
        duckdb::
        vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
        ::operator[]((vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
                      *)in_stack_fffffffffffffe60,(size_type)in_stack_fffffffffffffe58);
        duckdb::
        vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
        ::operator[]((vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
                      *)in_stack_fffffffffffffe60,(size_type)in_stack_fffffffffffffe58);
        duckdb::
        vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
        ::operator[]((vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
                      *)in_stack_fffffffffffffe60,(size_type)in_stack_fffffffffffffe58);
        duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                  ((unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true> *)
                   in_stack_fffffffffffffe60);
        piVar5 = duckdb::ConstantVector::GetData<int>((Vector *)0x15b7dc);
        duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                  ((unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true> *)
                   in_stack_fffffffffffffe60);
        pTVar6 = (TemplatedValidityMask<unsigned_long> *)
                 duckdb::ConstantVector::GetData<int>((Vector *)0x15b80e);
        in_stack_fffffffffffffe68 = pTVar6;
        in_stack_fffffffffffffe60 =
             duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::
             operator*((unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true> *)
                       in_stack_fffffffffffffe60);
        in_stack_fffffffffffffe58 = duckdb::ConstantVector::GetData<int>((Vector *)0x15b83d);
        piVar5[local_ec] = *(int *)(pTVar6 + iVar2 * 4) - in_stack_fffffffffffffe58[iVar3];
      }
    }
    else {
      duckdb::FlatVector::SetNull(local_18,(long)local_ec,true);
    }
  }
  if ((local_2d == CONSTANT_VECTOR) && (local_2e == CONSTANT_VECTOR)) {
    duckdb::Vector::SetVectorType((VectorType)local_18);
  }
  duckdb::Vector::Verify((ulong)local_18);
  duckdb::UnifiedVectorFormat::~UnifiedVectorFormat
            ((UnifiedVectorFormat *)in_stack_fffffffffffffe60);
  duckdb::UnifiedVectorFormat::~UnifiedVectorFormat
            ((UnifiedVectorFormat *)in_stack_fffffffffffffe60);
  return;
}

Assistant:

inline void SubPointFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	auto &left_vector = args.data[0];
	auto &right_vector = args.data[1];
	const int count = args.size();
	auto left_vector_type = left_vector.GetVectorType();
	auto right_vector_type = right_vector.GetVectorType();

	args.Flatten();
	UnifiedVectorFormat lhs_data;
	UnifiedVectorFormat rhs_data;
	left_vector.ToUnifiedFormat(count, lhs_data);
	right_vector.ToUnifiedFormat(count, rhs_data);

	result.SetVectorType(VectorType::FLAT_VECTOR);
	auto &child_entries = StructVector::GetEntries(result);
	auto &left_child_entries = StructVector::GetEntries(left_vector);
	auto &right_child_entries = StructVector::GetEntries(right_vector);
	for (int base_idx = 0; base_idx < count; base_idx++) {
		auto lhs_list_index = lhs_data.sel->get_index(base_idx);
		auto rhs_list_index = rhs_data.sel->get_index(base_idx);
		if (!lhs_data.validity.RowIsValid(lhs_list_index) || !rhs_data.validity.RowIsValid(rhs_list_index)) {
			FlatVector::SetNull(result, base_idx, true);
			continue;
		}
		for (size_t col = 0; col < child_entries.size(); ++col) {
			auto &child_entry = child_entries[col];
			auto &left_child_entry = left_child_entries[col];
			auto &right_child_entry = right_child_entries[col];
			auto pdata = ConstantVector::GetData<int32_t>(*child_entry);
			auto left_pdata = ConstantVector::GetData<int32_t>(*left_child_entry);
			auto right_pdata = ConstantVector::GetData<int32_t>(*right_child_entry);
			pdata[base_idx] = left_pdata[lhs_list_index] - right_pdata[rhs_list_index];
		}
	}
	if (left_vector_type == VectorType::CONSTANT_VECTOR && right_vector_type == VectorType::CONSTANT_VECTOR) {
		result.SetVectorType(VectorType::CONSTANT_VECTOR);
	}
	result.Verify(count);
}